

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>::
invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  bool bVar1;
  const_iterator rollback;
  region<std::vector<char,_std::allocator<char>_>_> *other;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  location<std::vector<char,_std::allocator<char>_>_> *loc_01;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_00;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  region<std::vector<char,_std::allocator<char>_>_> retval;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_110;
  region<std::vector<char,_std::allocator<char>_>_> local_c0;
  region<std::vector<char,_std::allocator<char>_>_> local_78;
  
  region<std::vector<char,_std::allocator<char>_>_>::region
            (&local_c0,(location<std::vector<char,_std::allocator<char>_>_> *)this);
  rollback._M_current = *(char **)(this + 0x40);
  in_range<(char)48,(char)57>::invoke<std::vector<char,std::allocator<char>>>
            (&local_110,(in_range<(char)48,(char)57> *)this,loc_00);
  bVar1 = local_110.is_ok_;
  if (local_110.is_ok_ == false) {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    rollback._M_current =
         (char *)result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 ::unwrap(&local_110);
    region<std::vector<char,_std::allocator<char>_>_>::operator+=
              (&local_c0,(region<std::vector<char,_std::allocator<char>_>_> *)rollback._M_current);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&local_110,(EVP_PKEY_CTX *)rollback._M_current);
  if (bVar1 != false) {
    loc_01 = extraout_RDX;
    do {
      in_range<(char)48,(char)57>::invoke<std::vector<char,std::allocator<char>>>
                (&local_110,(in_range<(char)48,(char)57> *)this,loc_01);
      bVar1 = local_110.is_ok_;
      if (local_110.is_ok_ == false) {
        region<std::vector<char,_std::allocator<char>_>_>::region(&local_78,&local_c0);
        other = &local_78;
        result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
        ::result(__return_storage_ptr__,(success_type *)&local_78);
        region<std::vector<char,_std::allocator<char>_>_>::~region(&local_78);
      }
      else {
        other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap(&local_110);
        region<std::vector<char,_std::allocator<char>_>_>::operator+=(&local_c0,other);
      }
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::cleanup(&local_110,(EVP_PKEY_CTX *)other);
      loc_01 = extraout_RDX_00;
    } while (bVar1 != false);
  }
  region<std::vector<char,_std::allocator<char>_>_>::~region(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }